

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O0

void DumpInternal(PtexTexture *tx)

{
  Header *pHVar1;
  ExtHeader *pEVar2;
  ostream *poVar3;
  PtexReader *in_RDI;
  LevelInfo *l;
  int i;
  ExtHeader *eh;
  Header *h;
  PtexReader *r;
  int in_stack_ffffffffffffffcc;
  PtexReader *in_stack_ffffffffffffffd0;
  int local_24;
  
  pHVar1 = Ptex::v2_2::PtexReader::header(in_RDI);
  pEVar2 = Ptex::v2_2::PtexReader::extheader(in_RDI);
  poVar3 = std::operator<<((ostream *)&std::cout,"Header:\n");
  std::operator<<(poVar3,"  magic: ");
  if (pHVar1->magic == 0x78657450) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\'Ptex\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pHVar1->magic);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"  version: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->version);
  poVar3 = std::operator<<(poVar3,'.');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->minorversion);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  meshtype: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->meshtype);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  datatype: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->datatype);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  alphachan: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->alphachan);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  nchannels: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->nchannels);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  nlevels: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->nlevels);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  nfaces: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->nfaces);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  extheadersize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->extheadersize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  faceinfosize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->faceinfosize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  constdatasize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->constdatasize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  levelinfosize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->levelinfosize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  leveldatasize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->leveldatasize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  metadatazipsize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->metadatazipsize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  metadatamemsize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pHVar1->metadatamemsize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  ubordermode: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->ubordermode);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  vbordermode: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->vbordermode);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  lmdheaderzipsize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->lmdheaderzipsize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  lmdheadermemsize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->lmdheadermemsize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  lmddatasize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->lmddatasize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  editdatasize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->editdatasize);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"  editdatapos: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar2->editdatapos);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Level info:\n");
  for (local_24 = 0; local_24 < (int)(uint)pHVar1->nlevels; local_24 = local_24 + 1) {
    in_stack_ffffffffffffffd0 =
         (PtexReader *)
         Ptex::v2_2::PtexReader::levelinfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    poVar3 = std::operator<<((ostream *)&std::cout,"  Level ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    leveldatasize: ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(ulong)(in_stack_ffffffffffffffd0->super_PtexTexture).
                                      _vptr_PtexTexture);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    levelheadersize: ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(in_stack_ffffffffffffffd0->readlock)._mutex.__data.__lock);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"    nfaces: ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(in_stack_ffffffffffffffd0->readlock)._mutex.__data.__count);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DumpInternal(PtexTexture* tx)
{
    PtexReader* r = static_cast<PtexReader*> (tx);

    const PtexIO::Header& h = r->header();
    const PtexIO::ExtHeader& eh = r->extheader();
    std::cout << "Header:\n"
              << "  magic: ";

    if (h.magic == PtexIO::Magic)
        std::cout << "'Ptex'" << std::endl;
    else
        std::cout << h.magic << std::endl;

    std::cout << "  version: " << h.version << '.' << h.minorversion << std::endl
              << "  meshtype: " << h.meshtype << std::endl
              << "  datatype: " << h.datatype << std::endl
              << "  alphachan: " << int(h.alphachan) << std::endl
              << "  nchannels: " << h.nchannels << std::endl
              << "  nlevels: " << h.nlevels << std::endl
              << "  nfaces: " << h.nfaces << std::endl
              << "  extheadersize: " << h.extheadersize << std::endl
              << "  faceinfosize: " << h.faceinfosize << std::endl
              << "  constdatasize: " << h.constdatasize << std::endl
              << "  levelinfosize: " << h.levelinfosize << std::endl
              << "  leveldatasize: " << h.leveldatasize << std::endl
              << "  metadatazipsize: " << h.metadatazipsize << std::endl
              << "  metadatamemsize: " << h.metadatamemsize << std::endl
              << "  ubordermode: " << eh.ubordermode << std::endl
              << "  vbordermode: " << eh.vbordermode << std::endl
              << "  lmdheaderzipsize: " << eh.lmdheaderzipsize << std::endl
              << "  lmdheadermemsize: " << eh.lmdheadermemsize << std::endl
              << "  lmddatasize: " << eh.lmddatasize << std::endl
              << "  editdatasize: " << eh.editdatasize << std::endl
              << "  editdatapos: " << eh.editdatapos << std::endl;

    std::cout << "Level info:\n";
    for (int i = 0; i < h.nlevels; i++) {
        const PtexIO::LevelInfo& l = r->levelinfo(i);
        std::cout << "  Level " << i << std::endl
                  << "    leveldatasize: " << l.leveldatasize << std::endl
                  << "    levelheadersize: " << l.levelheadersize << std::endl
                  << "    nfaces: " << l.nfaces << std::endl;
    }
}